

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslconfiguration.cpp
# Opt level: O2

QSslCertificate __thiscall QSslConfiguration::localCertificate(QSslConfiguration *this)

{
  long *in_RSI;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(*in_RSI + 0x38) == 0) {
    local_38.d = (Data *)0x0;
    local_38.ptr = (char *)0x0;
    local_38.size = 0;
    QSslCertificate::QSslCertificate((QSslCertificate *)this,(QByteArray *)&local_38,Pem);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_38);
    if (*(long *)(in_FS_OFFSET + 0x28) != local_18) goto LAB_0022a835;
  }
  else {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
LAB_0022a835:
      __stack_chk_fail();
    }
    QSslCertificate::QSslCertificate((QSslCertificate *)this,*(QSslCertificate **)(*in_RSI + 0x30));
  }
  return (QExplicitlySharedDataPointer<QSslCertificatePrivate>)
         (QExplicitlySharedDataPointer<QSslCertificatePrivate>)this;
}

Assistant:

QSslCertificate QSslConfiguration::localCertificate() const
{
    if (d->localCertificateChain.isEmpty())
        return QSslCertificate();
    return d->localCertificateChain[0];
}